

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

BrotliEncoderStateInternal *
duckdb_brotli::BrotliEncoderCreateInstance
          (brotli_alloc_func alloc_func,brotli_free_func free_func,void *opaque)

{
  undefined8 uVar1;
  BrotliEncoderStateInternal *params;
  
  params = (BrotliEncoderStateInternal *)BrotliBootstrapAlloc(0x1b40,alloc_func,free_func,opaque);
  if (params != (BrotliEncoderStateInternal *)0x0) {
    BrotliInitMemoryManager(&params->memory_manager_,alloc_func,free_func,opaque);
    BrotliEncoderInitParams((BrotliEncoderParams *)params);
    params->input_pos_ = 0;
    params->prev_byte_ = '\0';
    params->prev_byte2_ = '\0';
    params->stream_state_ = BROTLI_STREAM_PROCESSING;
    params->is_last_block_emitted_ = 0;
    params->is_initialized_ = 0;
    (params->ringbuffer_).cur_size_ = 0;
    (params->ringbuffer_).pos_ = 0;
    (params->ringbuffer_).data_ = (uint8_t *)0x0;
    (params->ringbuffer_).buffer_ = (uint8_t *)0x0;
    params->cmd_alloc_size_ = 0;
    params->commands_ = (Command *)0x0;
    params->num_commands_ = 0;
    params->num_literals_ = 0;
    params->last_insert_len_ = 0;
    params->last_flush_pos_ = 0;
    params->last_processed_pos_ = 0;
    params->storage_size_ = 0;
    params->storage_ = (uint8_t *)0x0;
    (params->hasher_).common.extra[0] = (void *)0x0;
    (params->hasher_).common.extra[1] = (void *)0x0;
    (params->hasher_).common.extra[2] = (void *)0x0;
    (params->hasher_).common.extra[3] = (void *)0x0;
    (params->hasher_).common.is_setup_ = 0;
    params->large_table_ = (int *)0x0;
    params->large_table_size_ = 0;
    params->one_pass_arena_ = (BrotliOnePassArena *)0x0;
    params->two_pass_arena_ = (BrotliTwoPassArena *)0x0;
    params->command_buf_ = (uint32_t *)0x0;
    params->literal_buf_ = (uint8_t *)0x0;
    params->total_in_ = 0;
    params->next_out_ = (uint8_t *)0x0;
    params->available_out_ = 0;
    params->total_out_ = 0;
    params->dist_cache_[0] = 4;
    params->dist_cache_[1] = 0xb;
    params->dist_cache_[2] = 0xf;
    params->dist_cache_[3] = 0x10;
    uVar1 = *(undefined8 *)(params->dist_cache_ + 2);
    *(undefined8 *)params->saved_dist_cache_ = *(undefined8 *)params->dist_cache_;
    *(undefined8 *)(params->saved_dist_cache_ + 2) = uVar1;
  }
  return params;
}

Assistant:

BrotliEncoderState* duckdb_brotli::BrotliEncoderCreateInstance(
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  BrotliEncoderState* state = (BrotliEncoderState*)BrotliBootstrapAlloc(
      sizeof(BrotliEncoderState), alloc_func, free_func, opaque);
  if (state == NULL) {
    /* BROTLI_DUMP(); */
    return 0;
  }
  BrotliInitMemoryManager(
      &state->memory_manager_, alloc_func, free_func, opaque);
  BrotliEncoderInitState(state);
  return state;
}